

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MasterSystem.cpp
# Opt level: O0

void __thiscall
Sega::MasterSystem::ConcreteMachine<(Analyser::Static::Sega::Target::Model)2>::set_scan_target
          (ConcreteMachine<(Analyser::Static::Sega::Target::Model)2> *this)

{
  ScanTarget *in_RSI;
  
  set_scan_target((ConcreteMachine<(Analyser::Static::Sega::Target::Model)2> *)
                  (this[-1].write_pointers_ + 0x3c),in_RSI);
  return;
}

Assistant:

void set_scan_target(Outputs::Display::ScanTarget *scan_target) final {
			vdp_.last_valid()->set_tv_standard(
				(region_ == Target::Region::Europe) ?
					TI::TMS::TVStandard::PAL : TI::TMS::TVStandard::NTSC);

			// Doing the following would be technically correct, but isn't
			// especially thread-safe and won't make a substantial difference.
//			time_until_debounce_ = vdp_->get_time_until_line(-1);

			vdp_.last_valid()->set_scan_target(scan_target);
		}